

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(int sign,int exponent,StorageType mantissa)

{
  int local_2c;
  bool local_25;
  StorageType exp;
  StorageType s;
  bool isDenormOrZero;
  bool isShorthandZero;
  StorageType mantissa_local;
  int exponent_local;
  int sign_local;
  
  local_25 = exponent == 0 && mantissa == 0;
  if ((local_25) || (exponent == -0x7e && mantissa >> 0x17 == 0)) {
    local_2c = 0;
  }
  else {
    local_2c = exponent + 0x7f;
  }
  Float((Float<unsigned_int,_8,_23,_127,_3U> *)&exponent_local,
        (uint)(sign < 0) << 0x1f | local_2c << 0x17 | mantissa & 0x7fffff);
  return (Float<unsigned_int,_8,_23,_127,_3U>)exponent_local;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::construct
	(int sign, int exponent, StorageType mantissa)
{
	// Repurpose this otherwise invalid input as a shorthand notation for zero (no need for caller to care about internal representation)
	const bool			isShorthandZero	= exponent == 0 && mantissa == 0;

	// Handles the typical notation for zero (min exponent, mantissa 0). Note that the exponent usually used exponent (-ExponentBias) for zero/subnormals is not used.
	// Instead zero/subnormals have the (normally implicit) leading mantissa bit set to zero.
	const bool			isDenormOrZero	= (exponent == 1 - ExponentBias) && (mantissa >> MantissaBits == 0);
	const StorageType	s				= StorageType((StorageType(sign < 0 ? 1 : 0)) << (StorageType(ExponentBits+MantissaBits)));
	const StorageType	exp				= (isShorthandZero  || isDenormOrZero) ? StorageType(0) : StorageType(exponent + ExponentBias);

	DE_ASSERT(sign == +1 || sign == -1);
	DE_ASSERT(isShorthandZero || isDenormOrZero || mantissa >> MantissaBits == 1);
	DE_ASSERT(exp >> ExponentBits == 0);

	return Float(StorageType(s | (exp << MantissaBits) | (mantissa & ((StorageType(1)<<MantissaBits)-1))));
}